

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

int64_t gguf_find_tensor(gguf_context *ctx,char *name)

{
  int iVar1;
  int64_t iVar2;
  char *__s2;
  gguf_context *in_RSI;
  int64_t i;
  int64_t n_tensors;
  int64_t tensor_id;
  int64_t in_stack_ffffffffffffffc8;
  gguf_context *__s1;
  long local_28;
  
  iVar2 = gguf_get_n_tensors((gguf_context *)0x18fdb1);
  local_28 = 0;
  while( true ) {
    if (iVar2 <= local_28) {
      return -1;
    }
    __s1 = in_RSI;
    __s2 = gguf_get_tensor_name(in_RSI,in_stack_ffffffffffffffc8);
    iVar1 = strcmp((char *)__s1,__s2);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int64_t gguf_find_tensor(const struct gguf_context * ctx, const char * name) {
    // return -1 if tensor not found
    int64_t tensor_id = -1;

    const int64_t n_tensors = gguf_get_n_tensors(ctx);

    for (int64_t i = 0; i < n_tensors; ++i) {
        if (strcmp(name, gguf_get_tensor_name(ctx, i)) == 0) {
            tensor_id = i;
            break;
        }
    }

    return tensor_id;
}